

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

c_v128 c_v128_pack_s32_s16(c_v128 a,c_v128 b)

{
  c_v64 hi;
  c_v64 lo;
  c_v64 in_RCX;
  c_v64 in_RDX;
  c_v64 in_RSI;
  c_v64 in_RDI;
  c_v128 cVar1;
  
  hi = c_v64_pack_s32_s16(in_RSI,in_RDI);
  lo = c_v64_pack_s32_s16(in_RCX,in_RDX);
  cVar1 = c_v128_from_v64(hi,lo);
  return cVar1;
}

Assistant:

SIMD_INLINE c_v128 c_v128_pack_s32_s16(c_v128 a, c_v128 b) {
  return c_v128_from_v64(c_v64_pack_s32_s16(a.v64[1], a.v64[0]),
                         c_v64_pack_s32_s16(b.v64[1], b.v64[0]));
}